

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O2

void pre_auth_append(pre_auth *pa,uint8_t *data,size_t len)

{
  uint8_t *__dest;
  
  __dest = le64(pa->current,len);
  pa->current = __dest;
  if (len != 0) {
    memcpy(__dest,data,len);
    __dest = pa->current;
  }
  pa->current = __dest + len;
  return;
}

Assistant:

void pre_auth_append(struct pre_auth *pa, const uint8_t *data, size_t len) {
    pa->current = le64(pa->current, len);
    if (len > 0) memcpy(pa->current, data, len);
    pa->current += len;
}